

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O1

void __thiscall MSX::AYPortHandler::Joystick::Joystick(Joystick *this)

{
  initializer_list<Inputs::Joystick::Input> __l;
  allocator_type local_89;
  vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> local_88;
  Input local_70;
  undefined4 local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  local_70.type = Up;
  local_70.info = (Info)0x0;
  local_60 = 1;
  local_58 = 0;
  local_50 = 2;
  local_48 = 0;
  local_40 = 3;
  local_38 = 0;
  local_30 = 6;
  local_28 = 0;
  local_20 = 6;
  local_18 = 1;
  __l._M_len = 6;
  __l._M_array = &local_70;
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::vector
            (&local_88,__l,&local_89);
  Inputs::ConcreteJoystick::ConcreteJoystick(&this->super_ConcreteJoystick,&local_88);
  if (local_88.super__Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_ConcreteJoystick).super_Joystick._vptr_Joystick =
       (_func_int **)&PTR__ConcreteJoystick_005a1e98;
  this->state_ = 0xff;
  return;
}

Assistant:

Joystick() :
					ConcreteJoystick({
						Input(Input::Up),
						Input(Input::Down),
						Input(Input::Left),
						Input(Input::Right),
						Input(Input::Fire, 0),
						Input(Input::Fire, 1),
					}) {}